

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::EncodeLiteralInplace(cmGlobalNinjaGenerator *this,string *lit)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  cmsys::SystemTools::ReplaceString(lit,"$","$$");
  cmsys::SystemTools::ReplaceString(lit,"\n","$\n");
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])(this);
  if ((char)iVar1 != '\0') {
    local_78.View_._M_str = local_78.Digits_;
    local_78.View_._M_len = 1;
    local_78.Digits_[0] = '$';
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x15])(this);
    local_48.View_._M_len = strlen((char *)CONCAT44(extraout_var,iVar1));
    local_48.View_._M_str = (char *)CONCAT44(extraout_var,iVar1);
    cmStrCat<>(&local_98,&local_78,&local_48);
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x15])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,(char *)CONCAT44(extraout_var_00,iVar1),&local_b9);
    cmsys::SystemTools::ReplaceString(lit,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::EncodeLiteralInplace(std::string& lit)
{
  cmSystemTools::ReplaceString(lit, "$", "$$");
  cmSystemTools::ReplaceString(lit, "\n", "$\n");
  if (this->IsMultiConfig()) {
    cmSystemTools::ReplaceString(lit, cmStrCat('$', this->GetCMakeCFGIntDir()),
                                 this->GetCMakeCFGIntDir());
  }
}